

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O3

void __thiscall czh::node::Node::Node(Node *this)

{
  undefined1 *puVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"");
  puVar1 = (undefined1 *)
           ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
                   super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
                   super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
                   super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
                   super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
                   super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 8);
  *(undefined8 *)
   ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 8) = 0;
  *(undefined8 *)
   ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 0x10) = 0;
  this->last_node = (Node *)0x0;
  *(undefined8 *)
   &(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
    super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
    super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
    super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
    super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
    super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value>._M_u = 0;
  *(undefined1 **)
   ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 0x18) =
       puVar1;
  *(undefined1 **)
   ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 0x20) =
       puVar1;
  *(undefined8 *)
   ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 0x28) = 0;
  puVar1 = (undefined1 *)
           ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
                   super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
                   super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
                   super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
                   super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
                   super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 0x30
           );
  *(undefined1 **)
   ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 0x38) =
       puVar1;
  *(undefined1 **)
   ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 0x30) =
       puVar1;
  *(undefined8 *)
   ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 0x40) = 0;
  *(__index_type *)
   ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
           super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 0x48) = '\0'
  ;
  (this->czh_token).type = UNEXPECTED;
  *(__index_type *)
   ((long)&(this->czh_token).what.value.
           super__Variant_base<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Move_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
           .
           super__Copy_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
           .
           super__Move_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
   + 0x20) = '\0';
  (this->czh_token).pos.pos = 0;
  (this->czh_token).pos.size = 0;
  (this->czh_token).pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->czh_token).pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::variant<czh::node::Node::NodeData,czh::value::Value>::emplace<0ul>
            ((variant<czh::node::Node::NodeData,czh::value::Value> *)&this->data);
  return;
}

Assistant:

Node() : name(""), last_node(nullptr) { data.emplace<NodeData>(); }